

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular
          (GridAxisIrregular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KUINT16 InitialIndexXi,KFLOAT64 CoordinateScaleXi,
          KFLOAT64 CoordinateOffsetXi,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *XiValues)

{
  size_type sVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *XiValues_local;
  KFLOAT64 CoordinateOffsetXi_local;
  KFLOAT64 CoordinateScaleXi_local;
  KUINT16 InitialIndexXi_local;
  KUINT8 AxisType_local;
  KUINT8 InterleafFactor_local;
  KUINT16 PointsXi_local;
  KFLOAT64 FinalXi_local;
  KFLOAT64 InitialXi_local;
  GridAxisIrregular *this_local;
  
  sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(XiValues);
  GridAxisRegular::GridAxisRegular
            (&this->super_GridAxisRegular,InitialXi,FinalXi,PointsXi,InterleafFactor,AxisType,
             (KUINT16)sVar1,InitialIndexXi);
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_0032e438;
  this->m_f64CoordScaleXi = CoordinateScaleXi;
  this->m_f64CoordOffsetXi = CoordinateOffsetXi;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vXiValues,XiValues);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16Padding);
  calculatePadding(this);
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                      KUINT8 AxisType, KUINT16 InitialIndexXi, KFLOAT64 CoordinateScaleXi,
                                      KFLOAT64 CoordinateOffsetXi, const vector<KUINT16> & XiValues ) :
    GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, XiValues.size(), InitialIndexXi ),
    m_f64CoordScaleXi( CoordinateScaleXi ),
    m_f64CoordOffsetXi( CoordinateOffsetXi ),
    m_vXiValues( XiValues )
{
    calculatePadding();
}